

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfSampleCountChannel.cpp
# Opt level: O0

void __thiscall Imf_2_5::SampleCountChannel::endEdit(SampleCountChannel *this)

{
  uint uVar1;
  size_t sVar2;
  _func_int **pp_Var3;
  ImageChannel *in_RDI;
  size_t i;
  DeepImageLevel *in_stack_ffffffffffffff90;
  ulong local_10;
  
  *(undefined8 *)&in_RDI[1]._pixelsPerColumn = 0;
  in_RDI[1]._numPixels = 0;
  local_10 = 0;
  while( true ) {
    sVar2 = ImageChannel::numPixels(in_RDI);
    if (sVar2 <= local_10) break;
    uVar1 = anon_unknown_6::roundListSizeUp
                      (*(uint *)((long)in_RDI[1]._vptr_ImageChannel + local_10 * 4));
    *(uint *)(*(long *)&in_RDI[1]._xSampling + local_10 * 4) = uVar1;
    *(size_t *)(*(long *)&in_RDI[1]._pLinear + local_10 * 8) = in_RDI[1]._numPixels;
    *(ulong *)&in_RDI[1]._pixelsPerColumn =
         (ulong)*(uint *)((long)in_RDI[1]._vptr_ImageChannel + local_10 * 4) +
         *(long *)&in_RDI[1]._pixelsPerColumn;
    in_RDI[1]._numPixels =
         (ulong)*(uint *)(*(long *)&in_RDI[1]._xSampling + local_10 * 4) + in_RDI[1]._numPixels;
    local_10 = local_10 + 1;
  }
  pp_Var3 = (_func_int **)anon_unknown_6::roundBufferSizeUp(in_RDI[1]._numPixels);
  in_RDI[2]._vptr_ImageChannel = pp_Var3;
  deepLevel((SampleCountChannel *)0x124053);
  DeepImageLevel::initializeSampleLists(in_stack_ffffffffffffff90);
  return;
}

Assistant:

void
SampleCountChannel::endEdit ()
{
    try
    {
        _totalNumSamples = 0;
        _totalSamplesOccupied = 0;

        for (size_t i = 0; i < numPixels(); ++i)
        {
            _sampleListSizes[i] = roundListSizeUp (_numSamples[i]);
            _sampleListPositions[i] = _totalSamplesOccupied;
            _totalNumSamples += _numSamples[i];
            _totalSamplesOccupied += _sampleListSizes[i];
        }

        _sampleBufferSize = roundBufferSizeUp (_totalSamplesOccupied);

        deepLevel().initializeSampleLists();
    }
    catch (...)
    {
        level().image().resize (Box2i (V2i (0, 0), V2i (-1, -1)));
        throw;
    }
}